

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::ShaderImageLoadStoreBase::AreOutputsAvailable
          (ShaderImageLoadStoreBase *this,int required)

{
  GLint GVar1;
  ostream *poVar2;
  GLint outputs;
  string local_1b0;
  ostringstream reason;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8f39,&outputs);
  GVar1 = outputs;
  if (outputs < 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&reason);
    poVar2 = std::operator<<((ostream *)&reason,"Required ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
    poVar2 = std::operator<<(poVar2," shader output resources but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,outputs);
    poVar2 = std::operator<<(poVar2," available.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&reason);
  }
  return 4 < GVar1;
}

Assistant:

bool AreOutputsAvailable(int required)
	{
		GLint outputs;
		glGetIntegerv(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, &outputs);
		if (outputs < required)
		{
			std::ostringstream reason;
			reason << "Required " << required << " shader output resources but only " << outputs << " available."
				   << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
		return true;
	}